

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.hpp
# Opt level: O0

matrix_type *
nanoNet::Trainer::weightsGradientFromPrevious
          (matrix_type *__return_storage_ptr__,vector_type *bias_gradients,
          vector_type *previous_values)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  size_type __n;
  const_reference pvVar4;
  reference this;
  reference pvVar5;
  ulong local_68;
  size_t j;
  size_t i;
  allocator<float> local_45;
  value_type_conflict local_44;
  vector<float,_std::allocator<float>_> local_40;
  undefined1 local_21;
  vector<float,_std::allocator<float>_> *local_20;
  vector_type *previous_values_local;
  vector_type *bias_gradients_local;
  matrix_type *weights_gradients;
  
  local_21 = 0;
  local_20 = previous_values;
  previous_values_local = bias_gradients;
  bias_gradients_local = (vector_type *)__return_storage_ptr__;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(bias_gradients);
  __n = std::vector<float,_std::allocator<float>_>::size(local_20);
  local_44 = 0.0;
  std::allocator<float>::allocator(&local_45);
  std::vector<float,_std::allocator<float>_>::vector(&local_40,__n,&local_44,&local_45);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&i + 3));
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,sVar3,&local_40,
           (allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&i + 3));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&i + 3));
  std::vector<float,_std::allocator<float>_>::~vector(&local_40);
  std::allocator<float>::~allocator(&local_45);
  for (j = 0; sVar3 = std::vector<float,_std::allocator<float>_>::size(previous_values_local),
      j < sVar3; j = j + 1) {
    for (local_68 = 0; sVar3 = std::vector<float,_std::allocator<float>_>::size(local_20),
        local_68 < sVar3; local_68 = local_68 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](previous_values_local,j);
      fVar1 = *pvVar4;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_20,local_68);
      fVar2 = *pvVar4;
      this = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](__return_storage_ptr__,j);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this,local_68);
      *pvVar5 = fVar1 * fVar2 + *pvVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static matrix_type weightsGradientFromPrevious(
        const vector_type& bias_gradients, const vector_type& previous_values)
    {
        matrix_type weights_gradients(
            bias_gradients.size(), vector_type(previous_values.size(), 0.0f));

        for (std::size_t i = 0; i < bias_gradients.size(); ++i)
            for (std::size_t j = 0; j < previous_values.size(); ++j)
                weights_gradients[i][j] += bias_gradients[i] * previous_values[j];

        return weights_gradients;
    }